

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::BatchedMatMulLayerParams
          (BatchedMatMulLayerParams *this,BatchedMatMulLayerParams *from)

{
  bool bVar1;
  InternalMetadataWithArenaLite *this_00;
  WeightParams *pWVar2;
  BatchedMatMulLayerParams *from_local;
  BatchedMatMulLayerParams *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BatchedMatMulLayerParams_0056f2e0;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  bVar1 = has_weights(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->weights_);
    this->weights_ = pWVar2;
  }
  else {
    this->weights_ = (WeightParams *)0x0;
  }
  bVar1 = has_bias(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->bias_);
    this->bias_ = pWVar2;
  }
  else {
    this->bias_ = (WeightParams *)0x0;
  }
  memcpy(&this->weightmatrixfirstdimension_,&from->weightmatrixfirstdimension_,0x14);
  return;
}

Assistant:

BatchedMatMulLayerParams::BatchedMatMulLayerParams(const BatchedMatMulLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  ::memcpy(&weightmatrixfirstdimension_, &from.weightmatrixfirstdimension_,
    reinterpret_cast<char*>(&int8dynamicquantize_) -
    reinterpret_cast<char*>(&weightmatrixfirstdimension_) + sizeof(int8dynamicquantize_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BatchedMatMulLayerParams)
}